

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

ostream * wasm::printModuleComponent(Expression *curr,ostringstream *stream,Module *wasm)

{
  streamoff sVar1;
  streamoff sVar2;
  ostream *poVar3;
  char *pcVar4;
  ModuleExpression local_50;
  fpos local_40 [16];
  undefined1 local_30 [8];
  pos_type MAX_OUTPUT;
  Module *wasm_local;
  ostringstream *stream_local;
  Expression *curr_local;
  
  if (curr != (Expression *)0x0) {
    MAX_OUTPUT._M_state = (__mbstate_t)wasm;
    stream_local = (ostringstream *)curr;
    std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)local_30,0x4000);
    local_40 = (fpos  [16])std::ostream::tellp();
    sVar1 = std::fpos::operator_cast_to_long(local_40);
    sVar2 = std::fpos::operator_cast_to_long((fpos *)local_30);
    if (sVar1 < sVar2) {
      std::pair<wasm::Module_&,_wasm::Expression_*>::pair<wasm::Expression_*&,_true>
                (&local_50,(Module *)MAX_OUTPUT._M_state,(Expression **)&stream_local);
      poVar3 = std::operator<<((ostream *)stream,local_50);
      std::operator<<(poVar3,'\n');
    }
    else {
      poVar3 = std::operator<<((ostream *)stream,"[not printing ");
      pcVar4 = getExpressionName((Expression *)stream_local);
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::operator<<(poVar3," because output is already very large]\n");
    }
  }
  return (ostream *)stream;
}

Assistant:

inline std::ostream& printModuleComponent(Expression* curr,
                                          std::ostringstream& stream,
                                          Module& wasm) {
  if (curr) {
    // Print the full expression if we can, but avoid doing so if the output is
    // already very large. This avoids quadratic output in some cases (e.g. if
    // we have many nested expressions in each other, all of which fail to
    // validate).
    const std::ostringstream::pos_type MAX_OUTPUT = 16 * 1024;
    if (stream.tellp() < MAX_OUTPUT) {
      stream << ModuleExpression(wasm, curr) << '\n';
    } else {
      // Print something, at least.
      stream << "[not printing " << getExpressionName(curr)
             << " because output is already very large]\n";
    }
  }
  return stream;
}